

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_store_fpr64(DisasContext_conflict6 *ctx,TCGv_i64 t,int reg)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 ret;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  if ((ctx->hflags & 0x40) == 0) {
    tcg_gen_deposit_i64_mips64el
              (tcg_ctx,tcg_ctx->fpu_f64[reg & 0xfffffffe],tcg_ctx->fpu_f64[reg & 0xfffffffe],t,0,
               0x20);
    ret = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_shri_i64_mips64el(tcg_ctx,ret,t,0x20);
    tcg_gen_deposit_i64_mips64el
              (tcg_ctx,tcg_ctx->fpu_f64[reg | 1],tcg_ctx->fpu_f64[reg | 1],ret,0,0x20);
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    return;
  }
  tcg_gen_mov_i64_mips64el(tcg_ctx,tcg_ctx->fpu_f64[(uint)reg],t);
  return;
}

Assistant:

static void gen_store_fpr64(DisasContext *ctx, TCGv_i64 t, int reg)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (ctx->hflags & MIPS_HFLAG_F64) {
        tcg_gen_mov_i64(tcg_ctx, tcg_ctx->fpu_f64[reg], t);
    } else {
        TCGv_i64 t0;
        tcg_gen_deposit_i64(tcg_ctx, tcg_ctx->fpu_f64[reg & ~1], tcg_ctx->fpu_f64[reg & ~1], t, 0, 32);
        t0 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_shri_i64(tcg_ctx, t0, t, 32);
        tcg_gen_deposit_i64(tcg_ctx, tcg_ctx->fpu_f64[reg | 1], tcg_ctx->fpu_f64[reg | 1], t0, 0, 32);
        tcg_temp_free_i64(tcg_ctx, t0);
    }
}